

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O1

void Gia_ManMarkSeqGiaWithBoxes(Gia_Man_t *p,int fSeq)

{
  Tim_Man_t *p_00;
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  long lVar8;
  Vec_Int_t *pVVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  
  p_00 = (Tim_Man_t *)p->pManTime;
  iVar2 = Tim_ManPiNum(p_00);
  iVar3 = Tim_ManPoNum(p_00);
  if (fSeq == 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = Gia_ManRegBoxNum(p);
  }
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x61,"void Gia_ManMarkSeqGiaWithBoxes(Gia_Man_t *, int)");
  }
  iVar5 = Gia_ManBoxNum(p);
  if (iVar5 < 1) {
    __assert_fail("Gia_ManBoxNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x62,"void Gia_ManMarkSeqGiaWithBoxes(Gia_Man_t *, int)");
  }
  Gia_ManIncrementTravId(p);
  if (p->nObjs < 1) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->nTravIdsAlloc < 1) {
LAB_0022c4e0:
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x261,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  piVar7 = p->pTravIds;
  *piVar7 = p->nTravIds;
  if (iVar2 - iVar4 != 0 && iVar4 <= iVar2) {
    pVVar6 = p->vCis;
    uVar10 = 0;
    do {
      lVar11 = (long)pVVar6->nSize;
      if (lVar11 - p->nRegs <= (long)uVar10) {
        __assert_fail("v < Gia_ManPiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
      }
      if (lVar11 <= (long)uVar10) goto LAB_0022c4c1;
      iVar5 = pVVar6->pArray[uVar10];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_0022c4a2;
      if (p->nTravIdsAlloc <= iVar5) goto LAB_0022c4e0;
      piVar7[iVar5] = p->nTravIds;
      uVar10 = uVar10 + 1;
    } while ((uint)(iVar2 - iVar4) != uVar10);
  }
  iVar5 = Gia_ManRegBoxNum(p);
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar2 = iVar5;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar2;
  if (iVar2 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar2 << 2);
  }
  pVVar6->pArray = piVar7;
  pVVar9 = p->vCos;
  iVar2 = pVVar9->nSize;
  uVar12 = iVar2 - (iVar3 + p->nRegs);
  iVar3 = iVar2 - p->nRegs;
  if ((int)uVar12 < iVar3 - iVar4) {
    uVar10 = (ulong)uVar12;
    do {
      iVar5 = (int)uVar10;
      if (iVar3 <= iVar5) {
LAB_0022c4ff:
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (((int)uVar12 < 0) || (iVar2 <= iVar5)) {
LAB_0022c4c1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar7 = pVVar9->pArray;
      iVar2 = piVar7[uVar10];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_0022c4a2;
      if (p->nTravIdsAlloc <= iVar2) goto LAB_0022c4e0;
      pGVar1 = p->pObjs;
      p->pTravIds[iVar2] = p->nTravIds;
      if (pVVar9->nSize - p->nRegs <= iVar5) goto LAB_0022c4ff;
      if (pVVar9->nSize <= iVar5) goto LAB_0022c4c1;
      iVar2 = piVar7[uVar10];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_0022c4a2;
      Gia_ManMarkSeqGiaWithBoxes_rec
                (p,pGVar1 + iVar2 + -(ulong)((uint)*(undefined8 *)(pGVar1 + iVar2) & 0x1fffffff),
                 pVVar6);
      uVar10 = uVar10 + 1;
      pVVar9 = p->vCos;
      iVar2 = pVVar9->nSize;
      iVar3 = iVar2 - p->nRegs;
    } while ((int)uVar10 < iVar3 - iVar4);
  }
  if ((fSeq != 0) && (0 < pVVar6->nSize)) {
    lVar11 = 0;
    do {
      iVar2 = pVVar6->pArray[lVar11];
      lVar8 = (long)iVar2;
      if ((lVar8 < 0) || (p->nObjs <= iVar2)) {
LAB_0022c4a2:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + lVar8;
      if ((-1 < (int)(uint)*(undefined8 *)pGVar1) ||
         (((uint)*(undefined8 *)pGVar1 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsCo(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                      ,0x74,"void Gia_ManMarkSeqGiaWithBoxes(Gia_Man_t *, int)");
      }
      if (p->nTravIdsAlloc <= iVar2) goto LAB_0022c4e0;
      p->pTravIds[lVar8] = p->nTravIds;
      Gia_ManMarkSeqGiaWithBoxes_rec
                (p,pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff),pVVar6);
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar6->nSize);
  }
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (int *)0x0;
  }
  free(pVVar6);
  return;
}

Assistant:

void Gia_ManMarkSeqGiaWithBoxes( Gia_Man_t * p, int fSeq )
{
    // CI order: real PIs + flop outputs + box outputs
    // CO order: box inputs + real POs + flop inputs
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Vec_Int_t * vRoots;
    Gia_Obj_t * pObj;
    int nRealCis = Tim_ManPiNum(pManTime);
    int nRealCos = Tim_ManPoNum(pManTime);
    int i, nRegs = fSeq ? Gia_ManRegBoxNum(p) : 0;
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManBoxNum(p) > 0 );
    // mark the terminals
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    for ( i = 0; i < nRealCis - nRegs; i++ )
        Gia_ObjSetTravIdCurrent( p, Gia_ManPi(p, i) );
    // collect flops reachable from the POs
    vRoots = Vec_IntAlloc( Gia_ManRegBoxNum(p) );
    for ( i = Gia_ManPoNum(p) - nRealCos; i < Gia_ManPoNum(p) - nRegs; i++ )
    {
        Gia_ObjSetTravIdCurrent( p, Gia_ManPo(p, i) );
        Gia_ManMarkSeqGiaWithBoxes_rec( p, Gia_ObjFanin0(Gia_ManPo(p, i)), vRoots );
    }
    // collect flops reachable from roots
    if ( fSeq )
    {
        Gia_ManForEachObjVec( vRoots, p, pObj, i )
        {
            assert( Gia_ObjIsCo(pObj) );
            Gia_ObjSetTravIdCurrent( p, pObj );
            Gia_ManMarkSeqGiaWithBoxes_rec( p, Gia_ObjFanin0(pObj), vRoots );
        }
        //printf( "Explored %d flops\n", Vec_IntSize(vRoots) );
    }
    Vec_IntFree( vRoots );
}